

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::Psbt(Psbt *this,Psbt *psbt)

{
  _Rb_tree_header *p_Var1;
  ByteData local_30;
  
  cfd::core::Psbt::GetData();
  cfd::core::Psbt::Psbt(&this->super_Psbt,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  *(undefined ***)this = &PTR__Psbt_002b3200;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::operator=(&(this->verify_ignore_map_)._M_t,&(psbt->verify_ignore_map_)._M_t);
  return;
}

Assistant:

Psbt::Psbt(const Psbt& psbt) : cfd::core::Psbt(psbt.GetData()) {
  verify_ignore_map_ = psbt.verify_ignore_map_;
}